

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * CTcPrsOpUnary::parse_list(void)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  tc_toktyp_t tVar5;
  CTPNListBase *this;
  CTcPrsNode *pCVar6;
  int errnum;
  char cVar7;
  
  CTcTokenizer::next(G_tok);
  this = (CTPNListBase *)CTcPrsMem::alloc(G_prsmem,0x50);
  (this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)0x0;
  *(undefined8 *)&this->cnt_ = 0;
  this->head_ = (CTPNListEle *)0x0;
  this->tail_ = (CTPNListEle *)0x0;
  *(undefined8 *)&this->const_val_ = 0;
  (this->const_val_).val_.intval_ = 0;
  (this->const_val_).val_.floatval_.len_ = 0;
  *(undefined8 *)((long)&(this->const_val_).val_ + 0x10) = 0;
  *(undefined8 *)&(this->const_val_).field_0x20 = 0;
  *(undefined8 *)&this->field_0x48 = 0;
  CTPNListBase::CTPNListBase(this);
  (this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR_gen_code_00321ef8;
  bVar2 = false;
  bVar4 = false;
LAB_00200dab:
  tVar5 = (G_tok->curtok_).typ_;
  if (0x1f < (int)tVar5) {
    if (tVar5 != TOKT_TIMES) {
      if (tVar5 == TOKT_SEM) goto switchD_00200dcf_caseD_10;
      goto switchD_00200dcf_caseD_12;
    }
    tVar5 = CTcTokenizer::next(G_tok);
    if (tVar5 != TOKT_ARROW) {
      CTcTokenizer::unget(G_tok);
      goto switchD_00200dcf_caseD_12;
    }
    CTcTokenizer::next(G_tok);
    bVar3 = true;
    if (bVar2) {
      bVar2 = true;
    }
    else {
      bVar2 = true;
      if (this->cnt_ != 0) {
        bVar2 = false;
        CTcTokenizer::log_error(0x2bd3);
        goto switchD_00200dcf_caseD_12;
      }
    }
    goto LAB_00200e4b;
  }
  switch(tVar5) {
  case TOKT_RESTR:
  case TOKT_LPAR:
  case TOKT_COMMA:
  case TOKT_DOT:
  case TOKT_LBRACE:
  case TOKT_LBRACK:
    goto switchD_00200dcf_caseD_12;
  case TOKT_RPAR:
    CTcTokenizer::log_error(0x2b0d);
    CTcTokenizer::next(G_tok);
    goto switchD_00200dcf_caseD_12;
  case TOKT_RBRACK:
    CTcTokenizer::next(G_tok);
    break;
  default:
    if (tVar5 != TOKT_EOF) goto switchD_00200dcf_caseD_12;
  case TOKT_DSTR_MID:
  case TOKT_DSTR_END:
  case TOKT_RBRACE:
switchD_00200dcf_caseD_10:
    CTcTokenizer::log_error_curtok(G_tok,0x2b0c);
  }
  goto LAB_002010b3;
switchD_00200dcf_caseD_12:
  bVar3 = bVar4;
LAB_00200e4b:
  pCVar6 = CTcPrsOpAsi::parse(&S_op_asi);
  if (pCVar6 == (CTcPrsNode *)0x0) {
    cVar7 = '\x01';
    goto LAB_00200ff0;
  }
  CTPNListBase::add_element(this,pCVar6);
  if (bVar3) {
    if ((G_tok->curtok_).typ_ == TOKT_RBRACK) {
      bVar3 = true;
      bVar4 = true;
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2bd5);
      bVar4 = false;
      bVar3 = false;
      if ((G_tok->curtok_).typ_ == TOKT_COMMA) {
        pCVar6 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x30);
        *(undefined4 *)&pCVar6[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 1;
        *(undefined1 *)&pCVar6[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
        (pCVar6->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031c798;
        CTPNListBase::add_element(this,pCVar6);
        goto LAB_00200edd;
      }
    }
  }
  else {
LAB_00200edd:
    bVar4 = false;
    bVar3 = false;
  }
  tVar5 = (G_tok->curtok_).typ_;
  if ((int)tVar5 < 0x17) {
    if ((tVar5 - TOKT_DSTR_MID < 2) || (tVar5 == TOKT_EOF)) goto LAB_00200fe0;
    if (tVar5 != TOKT_COMMA) goto LAB_00201066;
    CTcTokenizer::next(G_tok);
    if ((bVar2) && ((this->cnt_ & 1U) != 0)) {
      CTcTokenizer::log_error(0x2bd2,(ulong)(uint)((int)(this->cnt_ + 1U) >> 1));
      pCVar6 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x30);
      *(undefined4 *)&pCVar6[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 1;
      *(undefined1 *)&pCVar6[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
      (pCVar6->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031c798;
      CTPNListBase::add_element(this,pCVar6);
    }
    cVar7 = '\0';
    if ((G_tok->curtok_).typ_ != TOKT_RBRACK) goto LAB_00200ff0;
    errnum = 0x2b6e;
LAB_00200fe5:
    CTcTokenizer::log_error_curtok(G_tok,errnum);
    cVar7 = '\x05';
  }
  else if ((int)tVar5 < 0x28) {
    if (tVar5 - TOKT_LBRACE < 2) {
LAB_00200fe0:
      errnum = 0x2b0c;
      goto LAB_00200fe5;
    }
    if (tVar5 == TOKT_RBRACK) {
      CTcTokenizer::next(G_tok);
      cVar7 = '\x05';
      if ((bVar2) && (!bVar4 && (this->cnt_ & 1U) != 0)) {
        CTcTokenizer::log_error(0x2bd2,(ulong)(uint)((int)(this->cnt_ + 1U) >> 1));
      }
    }
    else {
LAB_00201066:
      CTcTokenizer::log_error_curtok(G_tok,0x2b0e);
      cVar7 = ((G_tok->curtok_).typ_ == TOKT_EOF) * '\x05';
    }
  }
  else {
    if (tVar5 != TOKT_ARROW) {
      if (tVar5 != TOKT_SEM) goto LAB_00201066;
      goto LAB_00200fe0;
    }
    CTcTokenizer::next(G_tok);
    uVar1 = this->cnt_;
    if (uVar1 != 1) {
      if (!bVar2) {
        bVar2 = false;
        CTcTokenizer::log_error(0x2bd3);
        cVar7 = '\0';
        goto LAB_00200ff0;
      }
      if ((uVar1 & 1) == 0) {
        CTcTokenizer::log_error(0x2bd4,(ulong)(uint)((int)uVar1 >> 1));
        pCVar6 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x30);
        *(undefined4 *)&pCVar6[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 1;
        *(undefined1 *)&pCVar6[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
        (pCVar6->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031c798;
        CTPNListBase::add_element(this,pCVar6);
      }
    }
    cVar7 = '\0';
    bVar2 = true;
  }
LAB_00200ff0:
  bVar4 = bVar3;
  if (cVar7 != '\0') {
    if (cVar7 == '\x05') {
LAB_002010b3:
      CTcGenTarg::note_list(G_cg,(long)this->cnt_);
      if (bVar2) {
        this->field_0x48 = this->field_0x48 | 2;
      }
    }
    else {
      this = (CTPNListBase *)0x0;
    }
    return &this->super_CTcPrsNode;
  }
  goto LAB_00200dab;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_list()
{
    /* assume this isn't a lookup table (with "key->val" pairs) */
    int is_lookup_table = FALSE;

    /* we're not at the default value for a lookup table ("*->val") */
    int at_def_val = FALSE;

    /* set up a nil value for adding placeholders (for error recovery) */
    CTcConstVal nilval;
    nilval.set_nil();
    
    /* skip the opening '[' */
    G_tok->next();

    /* 
     *   create the list expression -- we'll add elements to the list as
     *   we parse the elements
     */
    CTPNList *lst = new CTPNList();

    /* scan all list elements */
    for (;;)
    {
        /* check what we have */
        switch(G_tok->cur())
        {
        case TOKT_RBRACK:
            /* 
             *   that's the end of the list - skip the closing bracket and
             *   return the finished list 
             */
            G_tok->next();
            goto done;
            
        case TOKT_EOF:
        case TOKT_RBRACE:
        case TOKT_SEM:
        case TOKT_DSTR_MID:
        case TOKT_DSTR_END:
            /* 
             *   these would all seem to imply that the closing ']' was
             *   missing from the list; flag the error and end the list
             *   now 
             */
            G_tok->log_error_curtok(TCERR_LIST_MISSING_RBRACK);
            goto done;

        case TOKT_RPAR:
            /* 
             *   extra right paren - log an error, but then skip the paren
             *   and try to keep parsing
             */
            G_tok->log_error(TCERR_LIST_EXTRA_RPAR);
            G_tok->next();
            break;

        case TOKT_TIMES:
            /*
             *   If a -> follows, this is the default value for a lookup
             *   table list. 
             */
            if (G_tok->next() == TOKT_ARROW)
            {
                /* skip the arrow and get to the value */
                G_tok->next();

                /* 
                 *   if this is a non-lookup table list with other entries,
                 *   this is an error 
                 */
                if (!is_lookup_table && lst->get_count() != 0)
                {
                    /* log the error, but keep parsing the list */
                    G_tok->log_error(TCERR_ARROW_IN_LIST, lst->get_count());
                }
                else
                {
                    /* it's definitely a lookup list now */
                    is_lookup_table = TRUE;

                    /* we're now on the default value */
                    at_def_val = TRUE;
                }
            }
            else
            {
                /* it's not *-> - put back the next token */
                G_tok->unget();
            }

        default:
            /* it must be the next element expression */
            break;
        }

        /* 
         *   Attempt to parse another list element expression.  Parse just
         *   below a comma expression, because commas can be used to
         *   separate list elements.  
         */
        CTcPrsNode *ele = S_op_asi.parse();
        if (ele == 0)
            return 0;
        
        /* add the element to the list */
        lst->add_element(ele);

        /* if this was the default value, the list should end here */
        if (at_def_val && G_tok->cur() != TOKT_RBRACK)
        {
            /* log an error */
            G_tok->log_error_curtok(TCERR_LOOKUP_LIST_EXPECTED_END_AT_DEF);

            /* we've left the default value */
            at_def_val = FALSE;

            /* 
             *   if we're at a comma, add a nil value to the list to
             *   resynchronize - they must want to add more Key->Value pairs 
             */
            if (G_tok->cur() == TOKT_COMMA)
                lst->add_element(new CTPNConst(&nilval));
        }

        /* check what follows the element */
        switch(G_tok->cur())
        {
        case TOKT_COMMA:
            /* skip the comma introducing the next element */
            G_tok->next();

            /*
             *   If this is a lookup table list, commas are only allowed at
             *   even elements: [ODD -> EVEN, ODD -> EVEN...].
             */
            if (is_lookup_table && (lst->get_count() & 1) != 0)
            {
                /* log an error */
                G_tok->log_error(TCERR_LOOKUP_LIST_EXPECTED_ARROW,
                                 (lst->get_count()+1)/2);

                /* 
                 *   Add an implied nil element as the value.  This will help
                 *   resynchronize with the source code in the most likely
                 *   case that they simply left out a ->value item, so that
                 *   we don't log alternating "expected comma" and "expected
                 *   arrow" messages on every subsequent delimiter.  
                 */
                lst->add_element(new CTPNConst(&nilval));
            }

            /* if a close bracket follows, we seem to have an extra comma */
            if (G_tok->cur() == TOKT_RBRACK)
            {
                /* 
                 *   log an error about the missing element, then end the
                 *   list here 
                 */
                G_tok->log_error_curtok(TCERR_LIST_EXPECT_ELEMENT);
                goto done;
            }
            break;

        case TOKT_ARROW:
            /* skip the arrow */
            G_tok->next();

            /* 
             *   '->' indicates a lookup table key->value list.  This is an
             *   all-or-nothing proposition: it has to be on every pair of
             *   elements, or on none of them.
             */
            if (lst->get_count() == 1)
            {
                /* first element: this is now a lookup table list */
                is_lookup_table = TRUE;
            }
            else if (!is_lookup_table)
            {
                /* 
                 *   it's not the first element, and we haven't seen arrows
                 *   before, so this list shouldn't have arrows at all 
                 */
                G_tok->log_error(TCERR_ARROW_IN_LIST, lst->get_count());
            }
            else if (is_lookup_table && (lst->get_count() & 1) == 0)
            {
                /*
                 *   We have an even number of elements, so an arrow is not
                 *   allowed here under any circumstances. 
                 */
                G_tok->log_error(TCERR_MISPLACED_ARROW_IN_LIST,
                                 lst->get_count()/2);

                /* 
                 *   They probably just left out the key value accidentally,
                 *   so add a nil value as the key.  This will avoid a
                 *   cascade of errors for subsequent delimiters if they did
                 *   just leave out one item. 
                 */
                lst->add_element(new CTPNConst(&nilval));
            }
            break;

        case TOKT_RBRACK:
            /* 
             *   we're done with the list - skip the bracket and return
             *   the finished list 
             */
            G_tok->next();

            /* 
             *   If this is a lookup table list, make sure we ended on an
             *   even number - if not, we're missing a ->Value entry.  The
             *   exception is that if the last value was a default, we end on
             *   an odd item.  
             */
            if (is_lookup_table
                && (lst->get_count() & 1) != 0
                && !at_def_val)
            {
                /* log the error */
                G_tok->log_error(TCERR_LOOKUP_LIST_EXPECTED_ARROW,
                                 (lst->get_count()+1)/2);
            }
            goto done;

        case TOKT_EOF:
        case TOKT_LBRACE:
        case TOKT_RBRACE:
        case TOKT_SEM:
        case TOKT_DSTR_MID:
        case TOKT_DSTR_END:
            /* 
             *   these would all seem to imply that the closing ']' was
             *   missing from the list; flag the error and end the list
             *   now 
             */
            G_tok->log_error_curtok(TCERR_LIST_MISSING_RBRACK);
            goto done;

        default:
            /* 
             *   Anything else is an error - note that we expected a
             *   comma, then proceed with parsing from the current token
             *   as though we had found the comma (in all likelihood, the
             *   comma was accidentally omitted).  If we've reached the
             *   end of the file, return what we have so far, since it's
             *   pointless to keep looping.  
             */
            G_tok->log_error_curtok(TCERR_LIST_EXPECT_COMMA);

            /* give up on end of file, otherwise keep going */
            if (G_tok->cur() == TOKT_EOF)
                goto done;
            break;
        }
    }

done:
    /* tell the parser to note this list, in case it's the longest yet */
    G_cg->note_list(lst->get_count());

    /* if it's a lookup table list, mark it as such */
    if (is_lookup_table)
        lst->set_lookup_table();

    /* return the list */
    return lst;
}